

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Matcher::MatchLeadingTrailingSpaces
          (Matcher *this,Char *input,CharCount inputLength,CharCount offset)

{
  StandardChars<char16_t> *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  GroupInfo *this_01;
  undefined4 *puVar4;
  Program *pPVar5;
  StandardChars<char16_t> **ppSVar6;
  bool local_51;
  bool local_49;
  CharCount length;
  CharCount initOffset;
  StandardChars<char16_t> *stdchrs;
  GroupInfo *info;
  CharCount offset_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *this_local;
  
  this_01 = GroupIdToGroupInfo(this,0);
  if (inputLength < offset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x14ec,"(offset <= inputLength)","offset <= inputLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pPVar5 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
  if ((pPVar5->flags & MultilineRegexFlag) != NoRegexFlags) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x14ed,"((program->flags & MultilineRegexFlag) == 0)",
                       "(program->flags & MultilineRegexFlag) == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (offset < inputLength) {
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_StandardChars__
                        ((WriteBarrierPtr *)&this->standardChars);
    this_00 = *ppSVar6;
    info._0_4_ = offset;
    if (offset == 0) {
      while( true ) {
        local_49 = false;
        if ((CharCount)info < inputLength) {
          local_49 = StandardChars<char16_t>::IsWhitespaceOrNewline(this_00,input[(CharCount)info]);
        }
        if (local_49 == false) break;
        info._0_4_ = (CharCount)info + 1;
        CompStats(this);
      }
      pPVar5 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      if ((pPVar5->rep).boiLiteral2.literal <= (CharCount)info) {
        this_01->offset = 0;
        this_01->length = (CharCount)info;
        return true;
      }
    }
    uVar3 = (CharCount)info;
    if (inputLength == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x150f,"(inputLength > 0)","inputLength > 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    info._0_4_ = inputLength - 1;
    while( true ) {
      local_51 = false;
      if (uVar3 <= (CharCount)info) {
        local_51 = StandardChars<char16_t>::IsWhitespaceOrNewline(this_00,input[(CharCount)info]);
      }
      if (local_51 == false) break;
      if ((CharCount)info == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x1515,"(offset > 0)","offset > 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      info._0_4_ = (CharCount)info - 1;
      CompStats(this);
    }
    uVar3 = inputLength - ((CharCount)info + 1);
    pPVar5 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
    if (uVar3 < (pPVar5->rep).leadingTrailingSpaces.endMinMatch) {
      GroupInfo::Reset(this_01);
      this_local._7_1_ = false;
    }
    else {
      this_01->offset = (CharCount)info + 1;
      this_01->length = uVar3;
      this_local._7_1_ = true;
    }
  }
  else {
    if (offset != inputLength) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x14f1,"(offset == inputLength)","offset == inputLength");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pPVar5 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
    if (((pPVar5->rep).leadingTrailingSpaces.endMinMatch == 0) ||
       ((offset == 0 &&
        (pPVar5 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program),
        (pPVar5->rep).boiLiteral2.literal == 0)))) {
      this_01->offset = offset;
      this_01->length = 0;
      this_local._7_1_ = true;
    }
    else {
      GroupInfo::Reset(this_01);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool Matcher::MatchLeadingTrailingSpaces(const Char* const input, const CharCount inputLength, CharCount offset)
    {
        GroupInfo* const info = GroupIdToGroupInfo(0);
        Assert(offset <= inputLength);
        Assert((program->flags & MultilineRegexFlag) == 0);

        if (offset >= inputLength)
        {
            Assert(offset == inputLength);
            if (program->rep.leadingTrailingSpaces.endMinMatch == 0 ||
                (offset == 0 && program->rep.leadingTrailingSpaces.beginMinMatch == 0))
            {
                info->offset = offset;
                info->length = 0;
                return true;
            }
            info->Reset();
            return false;
        }

        const StandardChars<Char> &stdchrs = *standardChars;
        if (offset == 0)
        {
            while (offset < inputLength && stdchrs.IsWhitespaceOrNewline(input[offset]))
            {
                offset++;
#if ENABLE_REGEX_CONFIG_OPTIONS
                CompStats();
#endif
            }
            if (offset >= program->rep.leadingTrailingSpaces.beginMinMatch)
            {
                info->offset = 0;
                info->length = offset;
                return true;
            }
        }

        Assert(inputLength > 0);
        const CharCount initOffset = offset;
        offset = inputLength - 1;
        while (offset >= initOffset && stdchrs.IsWhitespaceOrNewline(input[offset]))
        {
            // This can never underflow since initOffset > 0
            Assert(offset > 0);
            offset--;
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
        }
        offset++;
        CharCount length = inputLength - offset;
        if (length >= program->rep.leadingTrailingSpaces.endMinMatch)
        {
            info->offset = offset;
            info->length = length;
            return true;
        }
        info->Reset();
        return false;
    }